

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeating_task.cc
# Opt level: O0

void __thiscall
dd::RepeatingTaskBase::RepeatingTaskBase
          (RepeatingTaskBase *this,TaskQueueBase *task_queue,int64_t first_delay)

{
  rep rVar1;
  int64_t first_delay_local;
  TaskQueueBase *task_queue_local;
  RepeatingTaskBase *this_local;
  
  QueuedTask::QueuedTask(&this->super_QueuedTask);
  (this->super_QueuedTask)._vptr_QueuedTask = (_func_int **)&PTR__RepeatingTaskBase_001c0bb0;
  this->_task_queue = task_queue;
  rVar1 = GetCurrentTick();
  this->_next_run_time = rVar1 + first_delay;
  return;
}

Assistant:

RepeatingTaskBase::RepeatingTaskBase(TaskQueueBase* task_queue,
		int64_t first_delay)
		: _task_queue(task_queue),
		_next_run_time(GetCurrentTick() + first_delay) {}